

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall
SslTcpSocketImpl::Connect(SslTcpSocketImpl *this,char *szIpToWhere,uint16_t sPort,int AddrHint)

{
  bool bVar1;
  pointer pSVar2;
  size_type sVar3;
  long lVar4;
  char *szFileName;
  SslTcpSocketImpl *local_d8;
  code *local_d0;
  undefined8 local_c8;
  type local_c0;
  function<void_(TcpSocketImpl_*)> local_a8;
  SslTcpSocketImpl *local_78;
  offset_in_BaseSocketImpl_to_subr local_70 [2];
  type local_60;
  function<void_()> local_48;
  undefined1 local_28 [16];
  int AddrHint_local;
  uint16_t sPort_local;
  char *szIpToWhere_local;
  SslTcpSocketImpl *this_local;
  
  local_28._8_4_ = AddrHint;
  local_28._14_2_ = sPort;
  _AddrHint_local = szIpToWhere;
  szIpToWhere_local = (char *)this;
  std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslClientContext&>
            ((SslClientContext *)local_28);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  operator=(&this->m_pSslCon,
            (unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)local_28);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_28);
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  local_70[1] = 0;
  local_70[0] = 0x11;
  local_78 = this;
  std::bind<void(BaseSocketImpl::*)(),SslTcpSocketImpl*>(&local_60,local_70,&local_78);
  std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar2,&local_48);
  std::function<void_()>::~function(&local_48);
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  OpenSSLWrapper::SslConnection::SetUserData(pSVar2,0,fnForwarder_abi_cxx11_);
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  OpenSSLWrapper::SslConnection::SetUserData(pSVar2,1,this);
  pSVar2 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  OpenSSLWrapper::SslConnection::SetSniName(pSVar2,_AddrHint_local);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_vProtoList);
  if (sVar3 != 0) {
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::SetAlpnProtokollNames(pSVar2,&this->m_vProtoList);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    szFileName = (char *)std::__cxx11::string::c_str();
    OpenSSLWrapper::SslConnection::SetTrustedRootCertificates(pSVar2,szFileName);
  }
  local_d0 = ConEstablished;
  local_c8 = 0;
  local_d8 = this;
  std::
  bind<void(SslTcpSocketImpl::*)(TcpSocketImpl_const*),SslTcpSocketImpl*,std::_Placeholder<1>const&>
            (&local_c0,(offset_in_SslTcpSocketImpl_to_subr *)&local_d0,&local_d8,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(TcpSocketImpl*)>::
  function<std::_Bind<void(SslTcpSocketImpl::*(SslTcpSocketImpl*,std::_Placeholder<1>))(TcpSocketImpl_const*)>,void>
            ((function<void(TcpSocketImpl*)> *)&local_a8,&local_c0);
  TcpSocketImpl::BindFuncConEstablished(&this->super_TcpSocketImpl,&local_a8);
  std::function<void_(TcpSocketImpl_*)>::~function(&local_a8);
  bVar1 = TcpSocketImpl::Connect
                    (&this->super_TcpSocketImpl,_AddrHint_local,local_28._14_2_,local_28._8_4_);
  return bVar1;
}

Assistant:

bool SslTcpSocketImpl::Connect(const char* const szIpToWhere, const uint16_t sPort, const int AddrHint/* = AF_UNSPEC*/)
{
    m_pSslCon = make_unique<SslConnection>(m_pClientCtx);
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    m_pSslCon->SetSniName(szIpToWhere);

    if (m_vProtoList.size() > 0)
        m_pSslCon->SetAlpnProtokollNames(m_vProtoList);
    if (m_strTrustRootCert.size() > 0)
        m_pSslCon->SetTrustedRootCertificates(m_strTrustRootCert.c_str());

    TcpSocketImpl::BindFuncConEstablished(bind(&SslTcpSocketImpl::ConEstablished, this, _1));
    return TcpSocketImpl::Connect(szIpToWhere, sPort, AddrHint);
}